

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Socket::Poll::Private::Private(Private *this)

{
  code *pcVar1;
  int iVar2;
  undefined1 local_28 [8];
  epoll_event ev;
  Private *this_local;
  
  HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::HashMap(&this->sockets);
  HashMap<Socket_*,_unsigned_int>::HashMap(&this->selectedSockets);
  iVar2 = epoll_create1(0x80000);
  this->fd = iVar2;
  iVar2 = eventfd(0,0x80000);
  this->eventFd = iVar2;
  local_28._0_4_ = 0x2011;
  stack0xffffffffffffffdc = 0;
  iVar2 = epoll_ctl(this->fd,1,this->eventFd,(epoll_event *)local_28);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Socket/Socket.cpp"
                          ,0x492,"epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

Socket::Poll::Private::Private()
{
  fd = epoll_create1(EPOLL_CLOEXEC);
  eventFd = eventfd(0, EFD_CLOEXEC);
  epoll_event ev;
  ev.events = EPOLLIN | EPOLLRDHUP | EPOLLHUP;
  ev.data.ptr = NULL;
  VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0);
}